

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O0

bool __thiscall
CppJieba::MixSegment::cut_type
          (MixSegment *this,const_iterator begin,const_iterator end,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *res)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  reference pvVar4;
  ulong uVar5;
  long lVar6;
  undefined8 in_RDX;
  undefined8 in_RSI;
  SegmentBase *in_RDI;
  uint j_1;
  uint j;
  uint i;
  string tmp;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  hmmRes;
  Unicode unico;
  vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_> infos;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_fffffffffffffdd8;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffde8;
  allocator *paVar7;
  vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_> *in_stack_fffffffffffffdf0
  ;
  char *local_1d0;
  char *local_190;
  uint local_170;
  allocator local_169;
  string local_168 [32];
  unsigned_short *local_148;
  unsigned_short *local_138;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  *in_stack_fffffffffffffed0;
  uint in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  const_iterator in_stack_fffffffffffffee0;
  const_iterator in_stack_fffffffffffffee8;
  vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_> *in_stack_fffffffffffffef0
  ;
  MPSegment *in_stack_fffffffffffffef8;
  const_iterator in_stack_ffffffffffffff00;
  const_iterator in_stack_ffffffffffffff08;
  uint local_dc;
  string local_d8 [32];
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  local_b8 [2];
  undefined4 local_88;
  allocator local_81;
  string local_80 [48];
  undefined8 local_50;
  undefined8 local_48;
  vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_> local_40;
  undefined8 local_18;
  undefined8 local_10;
  byte local_1;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = SegmentBase::_getInitFlag(in_RDI);
  if (!bVar1) {
    __assert_fail("_getInitFlag()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
                  ,0xad,
                  "virtual bool CppJieba::MixSegment::cut_type(Unicode::const_iterator, Unicode::const_iterator, vector<string> &) const"
                 );
  }
  bVar1 = __gnu_cxx::operator==
                    (in_stack_fffffffffffffde0,
                     (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                      *)in_stack_fffffffffffffdd8);
  if (bVar1) {
    local_1 = 0;
    goto LAB_00136ffa;
  }
  std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::vector
            ((vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_> *)0x136710);
  local_48 = local_10;
  local_50 = local_18;
  bVar1 = MPSegment::cut(in_stack_fffffffffffffef8,in_stack_ffffffffffffff08,
                         in_stack_ffffffffffffff00,in_stack_fffffffffffffef0);
  if (bVar1) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x1368c1);
    std::
    vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
    ::vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
              *)0x1368ce);
    std::__cxx11::string::string(local_d8);
    for (local_dc = 0;
        sVar3 = std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::size
                          (&local_40), local_dc < sVar3; local_dc = local_dc + 1) {
      std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::operator[]
                (&local_40,(ulong)local_dc);
      TransCode::encode((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                        in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      pvVar4 = std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::
               operator[](&local_40,(ulong)local_dc);
      sVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&pvVar4->word);
      if (sVar3 == 1) {
        pvVar4 = std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::
                 operator[](&local_40,(ulong)local_dc);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[](&pvVar4->word,0);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                   in_stack_fffffffffffffdf0,(value_type *)in_stack_fffffffffffffde8);
      }
      else {
        bVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::empty
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                           in_stack_fffffffffffffdf0);
        if (!bVar1) {
          std::
          vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          ::clear((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                   *)0x1369e2);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                    (in_stack_fffffffffffffdd8);
          __gnu_cxx::
          __normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>
          ::__normal_iterator<unsigned_short*>
                    (in_stack_fffffffffffffde0,
                     (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                      *)in_stack_fffffffffffffdd8);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                    (in_stack_fffffffffffffdd8);
          __gnu_cxx::
          __normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>
          ::__normal_iterator<unsigned_short*>
                    (in_stack_fffffffffffffde0,
                     (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                      *)in_stack_fffffffffffffdd8);
          bVar1 = HMMSegment::cut((HMMSegment *)
                                  CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                                  in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                                  in_stack_fffffffffffffed0);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
                             ,0x2f);
            if (pcVar2 == (char *)0x0) {
              local_1d0 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
              ;
            }
            else {
              local_1d0 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
                                  ,0x2f);
              local_1d0 = local_1d0 + 1;
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&stack0xfffffffffffffee0,"_hmmSeg cut failed.",
                       (allocator *)&stack0xfffffffffffffedf);
            Limonp::Logger::LoggingF(3,local_1d0,0xc9,(string *)&stack0xfffffffffffffee0);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
            std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffedf);
            local_1 = 0;
            goto LAB_00136f8a;
          }
          for (in_stack_fffffffffffffed8 = 0; uVar5 = (ulong)in_stack_fffffffffffffed8,
              sVar3 = std::
                      vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                      ::size(local_b8), uVar5 < sVar3;
              in_stack_fffffffffffffed8 = in_stack_fffffffffffffed8 + 1) {
            std::
            vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
            ::operator[](local_b8,(ulong)in_stack_fffffffffffffed8);
            TransCode::encode((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                              in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
          }
        }
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x136c24);
        std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::operator[]
                  (&local_40,(ulong)local_dc);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          pvVar4 = std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::
                   operator[](&local_40,(ulong)local_dc);
          lVar6 = std::__cxx11::string::find((char *)&pvVar4->tag,0x14fb59);
          if (lVar6 == -1) {
            pvVar4 = std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::
                     operator[](&local_40,(ulong)local_dc);
            lVar6 = std::__cxx11::string::find((char *)&pvVar4->tag,0x14fb5b);
            if (lVar6 == -1) goto LAB_00136d05;
          }
        }
        std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::operator[]
                  (&local_40,(ulong)local_dc);
        TransCode::encode((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                          in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      }
LAB_00136d05:
    }
    bVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::empty
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                       in_stack_fffffffffffffdf0);
    if (bVar1) {
LAB_00136f77:
      local_1 = 1;
    }
    else {
      std::
      vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ::clear((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
               *)0x136d44);
      local_138 = (unsigned_short *)
                  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                            (in_stack_fffffffffffffdd8);
      __gnu_cxx::
      __normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>
      ::__normal_iterator<unsigned_short*>
                (in_stack_fffffffffffffde0,
                 (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                  *)in_stack_fffffffffffffdd8);
      local_148 = (unsigned_short *)
                  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                            (in_stack_fffffffffffffdd8);
      __gnu_cxx::
      __normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>
      ::__normal_iterator<unsigned_short*>
                (in_stack_fffffffffffffde0,
                 (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                  *)in_stack_fffffffffffffdd8);
      bVar1 = HMMSegment::cut((HMMSegment *)
                              CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                              in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                              in_stack_fffffffffffffed0);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_170 = 0;
        while( true ) {
          uVar5 = (ulong)local_170;
          sVar3 = std::
                  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                  ::size(local_b8);
          if (sVar3 <= uVar5) break;
          std::
          vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          ::operator[](local_b8,(ulong)local_170);
          TransCode::encode((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
          local_170 = local_170 + 1;
        }
        goto LAB_00136f77;
      }
      pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
                       ,0x2f);
      if (pcVar2 == (char *)0x0) {
        pcVar2 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
        ;
      }
      else {
        pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
                         ,0x2f);
        pcVar2 = pcVar2 + 1;
      }
      paVar7 = &local_169;
      in_stack_fffffffffffffdf0 =
           (vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_> *)pcVar2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_168,"_hmmSeg cut failed.",paVar7);
      Limonp::Logger::LoggingF(3,pcVar2,0xe6,(string *)local_168);
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
      local_1 = 0;
    }
LAB_00136f8a:
    local_88 = 1;
    std::__cxx11::string::~string(local_d8);
    std::
    vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
    ::~vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
               *)in_stack_fffffffffffffdf0);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffdf0)
    ;
  }
  else {
    pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
                     ,0x2f);
    if (pcVar2 == (char *)0x0) {
      local_190 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
      ;
    }
    else {
      local_190 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
                          ,0x2f);
      local_190 = local_190 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"mpSeg cutDAG failed.",&local_81);
    Limonp::Logger::LoggingF(3,local_190,0xb5,(string *)local_80);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    local_1 = 0;
    local_88 = 1;
  }
  std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::~vector
            (in_stack_fffffffffffffdf0);
LAB_00136ffa:
  return (bool)(local_1 & 1);
}

Assistant:

virtual bool cut_type(Unicode::const_iterator begin, Unicode::const_iterator end, vector<string>& res)const
            {
				assert(_getInitFlag());
                if(begin == end)
                {
                    return false;
                }
                vector<TrieNodeInfo> infos;
                if(!_mpSeg.cut(begin, end, infos))
                {
                    LogError("mpSeg cutDAG failed.");
                    return false;
                }
                Unicode unico;
                vector<Unicode> hmmRes;
                string tmp;
                for(uint i= 0; i < infos.size(); i++)
                {
                    TransCode::encode(infos[i].word,tmp);
                    if(1 == infos[i].word.size())
                    {
                        unico.push_back(infos[i].word[0]);
                    }
                    else
                    {
                        if(!unico.empty())
                        {
                            hmmRes.clear();
                            if(!_hmmSeg.cut(unico.begin(), unico.end(), hmmRes))
                            {
                                LogError("_hmmSeg cut failed.");
                                return false;
                            }
                            for(uint j = 0; j < hmmRes.size(); j++)
                            {
                                TransCode::encode(hmmRes[j], tmp);
                                res.push_back(tmp);
                            }
                        }
                        unico.clear();

						/* Ignore "Not n,v words" */
						//TransCode::encode(infos[i].word, tmp); //Just test
						//cout<<tmp<<infos[i].tag<<" / ";
						if( (infos[i].tag.empty())
								|| (string::npos != infos[i].tag.find("n"))
								|| (string::npos != infos[i].tag.find("v"))
							)
						{
							TransCode::encode(infos[i].word, tmp);
							res.push_back(tmp);
						}
                    }
                }
                if(!unico.empty())
                {
                    hmmRes.clear();
                    if(!_hmmSeg.cut(unico.begin(), unico.end(), hmmRes))
                    {
                        LogError("_hmmSeg cut failed.");
                        return false;
                    }
                    for(uint j = 0; j < hmmRes.size(); j++)
                    {
                        TransCode::encode(hmmRes[j], tmp);
                        res.push_back(tmp);
                    }
                }

                return true;
            }